

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void QPDFObjectHandle::parseContentStream_data
               (shared_ptr<Buffer> *stream_data,string *description,ParserCallbacks *callbacks,
               QPDF *context)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long uVar3;
  qpdf_offset_t qVar4;
  unsigned_long uVar5;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  char ch;
  qpdf_offset_t offset;
  string *local_2e0;
  QPDFObjectHandle obj;
  undefined1 local_2b0 [16];
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  sp_description;
  string local_290;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  local_260;
  string local_250;
  QPDFExc local_230;
  Tokenizer tokenizer;
  BufferInputSource input;
  
  sVar2 = Buffer::getSize((stream_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
  local_2e0 = description;
  BufferInputSource::BufferInputSource
            (&input,description,
             (stream_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,false);
  ::qpdf::Tokenizer::Tokenizer(&tokenizer);
  ::qpdf::Tokenizer::allowEOF(&tokenizer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"content",(allocator<char> *)&local_290);
  QPDFParser::make_description((QPDFParser *)&sp_description,local_2e0,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  do {
    local_230._0_8_ = BufferInputSource::tell(&input);
    uVar3 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                      ((longlong *)&local_230);
    if (sVar2 <= uVar3) {
LAB_0019b99c:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sp_description.
                  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ::qpdf::Tokenizer::~Tokenizer(&tokenizer);
      BufferInputSource::~BufferInputSource(&input);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"content",(allocator<char> *)&local_290);
    ::qpdf::Tokenizer::nextToken(&tokenizer,&input.super_InputSource,(string *)&local_230,1);
    std::__cxx11::string::~string((string *)&local_230);
    offset = InputSource::getLastOffset(&input.super_InputSource);
    BufferInputSource::seek(&input,offset,0);
    std::
    __shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_260,
                   &sp_description.
                    super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
                  );
    QPDFParser::parse_content
              ((QPDFParser *)&obj,&input.super_InputSource,
               (shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
                *)&local_260,&tokenizer,context);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
    if (obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&obj.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      goto LAB_0019b99c;
    }
    qVar4 = BufferInputSource::tell(&input);
    local_230._0_8_ = qVar4 - offset;
    uVar3 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                      ((longlong *)&local_230);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_270,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&obj);
    uVar5 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert(&offset);
    (*callbacks->_vptr_ParserCallbacks[3])(callbacks,&local_270,uVar5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
    bVar1 = isOperator(&obj);
    if (bVar1) {
      getOperatorValue_abi_cxx11_((string *)&local_230,&obj);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_230,"ID");
      std::__cxx11::string::~string((string *)&local_230);
      if (bVar1) {
        BufferInputSource::read(&input,(int)&ch,(void *)0x1,uVar3);
        ::qpdf::Tokenizer::expectInlineImage(&tokenizer,&input.super_InputSource);
        ::qpdf::Tokenizer::nextToken(&tokenizer,&input.super_InputSource,local_2e0,0);
        offset = InputSource::getLastOffset(&input.super_InputSource);
        qVar4 = BufferInputSource::tell(&input);
        local_230._0_8_ = qVar4 - offset;
        uVar3 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                          ((longlong *)&local_230);
        if (tokenizer.type == tt_bad) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_290,"stream data",&local_2ea);
          qVar4 = BufferInputSource::tell(&input);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"EOF found while reading inline image",&local_2eb);
          QPDFExc::QPDFExc(&local_230,qpdf_e_damaged_pdf,local_2e0,&local_290,qVar4,&local_250);
          warn(context,&local_230);
          QPDFExc::~QPDFExc(&local_230);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_290);
        }
        else {
          newInlineImage((string *)local_2b0);
          uVar5 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert(&offset);
          (*callbacks->_vptr_ParserCallbacks[3])(callbacks,local_2b0,uVar5,uVar3);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2b0 + 8));
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

void
QPDFObjectHandle::parseContentStream_data(
    std::shared_ptr<Buffer> stream_data,
    std::string const& description,
    ParserCallbacks* callbacks,
    QPDF* context)
{
    size_t stream_length = stream_data->getSize();
    auto input = BufferInputSource(description, stream_data.get());
    Tokenizer tokenizer;
    tokenizer.allowEOF();
    auto sp_description = QPDFParser::make_description(description, "content");
    while (QIntC::to_size(input.tell()) < stream_length) {
        // Read a token and seek to the beginning. The offset we get from this process is the
        // beginning of the next non-ignorable (space, comment) token. This way, the offset and
        // don't including ignorable content.
        tokenizer.nextToken(input, "content", true);
        qpdf_offset_t offset = input.getLastOffset();
        input.seek(offset, SEEK_SET);
        auto obj = QPDFParser::parse_content(input, sp_description, tokenizer, context);
        if (!obj) {
            // EOF
            break;
        }
        size_t length = QIntC::to_size(input.tell() - offset);

        callbacks->handleObject(obj, QIntC::to_size(offset), length);
        if (obj.isOperator() && (obj.getOperatorValue() == "ID")) {
            // Discard next character; it is the space after ID that terminated the token.  Read
            // until end of inline image.
            char ch;
            input.read(&ch, 1);
            tokenizer.expectInlineImage(input);
            tokenizer.nextToken(input, description);
            offset = input.getLastOffset();
            length = QIntC::to_size(input.tell() - offset);
            if (tokenizer.getType() == QPDFTokenizer::tt_bad) {
                QTC::TC("qpdf", "QPDFObjectHandle EOF in inline image");
                warn(
                    context,
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        description,
                        "stream data",
                        input.tell(),
                        "EOF found while reading inline image"));
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle inline image token");
                callbacks->handleObject(
                    QPDFObjectHandle::newInlineImage(tokenizer.getValue()),
                    QIntC::to_size(offset),
                    length);
            }
        }
    }
}